

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

void process(lzma_check_state *check)

{
  __uint32_t _Var1;
  ulong local_60;
  size_t i;
  uint32_t data [16];
  lzma_check_state *check_local;
  
  for (local_60 = 0; local_60 < 0x10; local_60 = local_60 + 1) {
    _Var1 = __bswap_32((check->buffer).u32[local_60]);
    data[local_60 - 2] = _Var1;
  }
  transform(&(check->state).crc32,(uint32_t *)&i);
  return;
}

Assistant:

static void
process(lzma_check_state *check)
{
#ifdef WORDS_BIGENDIAN
	transform(check->state.sha256.state, check->buffer.u32);

#else
	uint32_t data[16];
	size_t i;

	for (i = 0; i < 16; ++i)
		data[i] = bswap32(check->buffer.u32[i]);

	transform(check->state.sha256.state, data);
#endif

	return;
}